

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

void __thiscall catalog::catalog(catalog *this)

{
  _Ios_Openmode _Var1;
  streamoff sVar2;
  ostream *poVar3;
  void *this_00;
  TableInfo *this_01;
  undefined1 auVar4 [16];
  __enable_if_t<is_constructible<value_type,_pair<int,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  undefined1 local_550 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  undefined1 local_518 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p_1;
  size_t len_1;
  string indexName;
  int local_4c8;
  value_type_conflict local_4c4;
  int constraint;
  int type;
  string attributeName;
  int local_49c;
  char *pcStack_498;
  int j;
  char *buf;
  size_t size;
  TableInfo *tableInfo;
  undefined8 local_478;
  undefined1 local_470 [8];
  size_t len;
  undefined8 uStack_460;
  bool state;
  undefined8 local_458;
  value_type_conflict1 local_450;
  size_t pos;
  int i;
  undefined8 local_438;
  undefined1 local_430 [8];
  ifstream IndexNamelist;
  char local_218 [8];
  ifstream tablelist;
  catalog *this_local;
  
  std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::vector(&this->TableInfoList);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->file_offset);
  this->tableNumber = 0;
  this->anychangeornot = false;
  _Var1 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_218,"./file/catalog/table.dat",_Var1);
  _Var1 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_430,"./file/IndexNamelist.dat",_Var1);
  std::istream::seekg((long)local_218,_S_beg);
  _i = std::istream::tellg();
  sVar2 = std::fpos::operator_cast_to_long((fpos *)&i);
  if (sVar2 == 0) {
    pos._4_4_ = 1;
  }
  else {
    std::istream::seekg((long)local_218,_S_beg);
    std::istream::read(local_218,(long)&this->tableNumber);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->tableNumber);
    poVar3 = std::operator<<(poVar3," tables in total");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pos._0_4_ = 0;
    while ((int)pos < this->tableNumber) {
      auVar4 = std::istream::tellg();
      _uStack_460 = auVar4;
      local_450 = std::fpos::operator_cast_to_long((fpos *)&stack0xfffffffffffffba0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->file_offset,&local_450);
      std::istream::read(local_218,(long)&len + 7);
      std::istream::read(local_218,(long)local_470);
      if ((len._7_1_ & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"find deleted table");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::istream::seekg((long)local_218,local_470._0_4_);
        auVar4 = std::istream::tellg();
        local_478 = auVar4._8_8_;
        tableInfo = auVar4._0_8_;
        sVar2 = std::fpos::operator_cast_to_long((fpos *)&tableInfo);
        this_00 = (void *)std::ostream::operator<<(&std::cout,sVar2);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->file_offset);
      }
      else {
        pos._0_4_ = (int)pos + 1;
        this_01 = (TableInfo *)operator_new(0xd8);
        TableInfo::TableInfo(this_01);
        size = (size_t)this_01;
        std::istream::read(local_218,(long)&buf);
        pcStack_498 = (char *)operator_new__((ulong)(buf + 1));
        std::istream::read(local_218,(long)pcStack_498);
        pcStack_498[(long)buf] = '\0';
        std::__cxx11::string::operator=((string *)size,pcStack_498);
        std::istream::read(local_218,size + 0x20);
        for (local_49c = 0; local_49c < *(int *)(size + 0x20); local_49c = local_49c + 1) {
          std::__cxx11::string::string((string *)&constraint);
          std::istream::read(local_218,(long)&buf);
          pcStack_498 = (char *)operator_new__((ulong)(buf + 1));
          std::istream::read(local_218,(long)pcStack_498);
          pcStack_498[(long)buf] = '\0';
          std::__cxx11::string::operator=((string *)&constraint,pcStack_498);
          std::istream::read(local_218,(long)&local_4c4);
          std::istream::read(local_218,(long)&local_4c8);
          if ((local_4c8 == 4) || (local_4c8 == 3)) {
            if (local_4c8 == 3) {
              *(int *)(size + 0xd0) = local_49c;
            }
            std::__cxx11::string::string((string *)&len_1);
            std::istream::read(local_218,(long)&p_1.field_0x20);
            pcStack_498 = (char *)operator_new__(p_1._32_8_ + 1);
            std::istream::read(local_218,(long)pcStack_498);
            pcStack_498[(long)buf] = '\0';
            std::__cxx11::string::operator=((string *)&len_1,pcStack_498);
            std::make_pair<int&,std::__cxx11::string&>
                      ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_518,&local_49c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len_1);
            _Var5 = std::
                    map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    ::insert<std::pair<int,std::__cxx11::string>&>
                              ((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                                *)(size + 0xa0),
                               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_518);
            p._32_8_ = _Var5.first._M_node;
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_518);
            std::__cxx11::string::~string((string *)&len_1);
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(size + 0x40),&local_4c4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(size + 0x28),(value_type *)&constraint);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(size + 0x58),&local_4c8);
          std::make_pair<std::__cxx11::string&,int&>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &constraint,&local_49c);
          std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::insert<std::pair<std::__cxx11::string,int>&>
                    ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)(size + 0x70),
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)local_550);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                   *)local_550);
          std::__cxx11::string::~string((string *)&constraint);
        }
        std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::push_back
                  (&this->TableInfoList,(value_type *)&size);
        poVar3 = std::operator<<((ostream *)&std::cout,"load table :");
        poVar3 = std::operator<<(poVar3,(string *)size);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    std::ifstream::close();
    std::ifstream::close();
    pos._4_4_ = 0;
  }
  std::ifstream::~ifstream(local_430);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

catalog::catalog(){
    tableNumber = 0;
    anychangeornot = false;
    std::ifstream tablelist("./file/catalog/table.dat", std::ios::in | std::ios::binary);
    std::ifstream IndexNamelist("./file/IndexNamelist.dat", std::ios::in | std::ios::binary);
    tablelist.seekg(0,std::ios::end); 
    // std::cout << tablelist.tellg() << std::endl;
    if(tablelist.tellg() == 0){
        return;//文件为空
    }
    else{
        tablelist.seekg(0,std::ios::beg);
        tablelist.read((char*)(&tableNumber),sizeof(int));
        std::cout<<tableNumber<<" tables in total"<<std::endl;
        int i = 0;
        while(i < tableNumber){
            //usleep(1*1000000);
            size_t pos = tablelist.tellg();
            //std::cout << "offset "<<pos<<std::endl;
            file_offset.push_back(pos);
            bool state;
            tablelist.read((char*)(&state),sizeof(bool));
            //std::cout<<state<<std::endl; 
            size_t len;
            tablelist.read((char*)(&len),sizeof(len));
            if(!state){
               std::cout<<"find deleted table"<<std::endl;
                tablelist.seekg(len,std::ios::cur);//跳过被删除的table
                std::cout<<tablelist.tellg()<<std::endl;//跳过被删除的table
                file_offset.pop_back();
                continue;
            }
            i++;
            TableInfo* tableInfo = new TableInfo();
            size_t size;
            //读入table的名字
            tablelist.read((char*)(&size),sizeof(size));
            char* buf = new char[size+1];
            tablelist.read(buf, size);
            buf[size] = '\0';
            tableInfo->tableName = buf;
            //读入colunm的数目
            tablelist.read((char*)(&(tableInfo->attributeNum)),sizeof(int));
            //读入列的信息
            for(int j = 0 ; j < tableInfo->attributeNum ; j ++){
                std::string attributeName;
                int type;
                int constraint;
                //
                tablelist.read((char*)(&size),sizeof(size));
                buf = new char[size+1];
                tablelist.read(buf, size);
                buf[size] = '\0';
                attributeName = buf;
                tablelist.read((char*)(&type),sizeof(int));
                tablelist.read((char*)(&constraint),sizeof(int));
                if(constraint == 4 || constraint == 3){
                    if(constraint == 3)tableInfo->primary_key_id = j;
                    //添加index信息
                    std::string indexName;
                    size_t len;
                    tablelist.read((char*)(&len),sizeof(len));
                    buf = new char[len+1];
                    tablelist.read(buf,len);
                    buf[size] = '\0';
                    indexName = buf;
                    std::pair<int,std::string> p = std::make_pair(j, indexName);
                    // tableInfo->indexInfo.push_back(p);
                    tableInfo->indexInfo.insert(p);  
                }
                tableInfo->type.push_back(type);
                tableInfo->attributeName.push_back(attributeName);
                tableInfo->constraint.push_back(constraint);
                std::pair<std::string,int> p = std::make_pair(attributeName,j);
                tableInfo->getID.insert(p); 
            }
            TableInfoList.push_back(tableInfo);//推入tablenfolist中
            std::cout<<"load table :"<<tableInfo->tableName<<std::endl;
        }
    }
    IndexNamelist.close();
    tablelist.close();
}